

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O2

FieldDescriptor **
google::protobuf::compiler::objectivec::anon_unknown_7::SortFieldsByNumber(Descriptor *descriptor)

{
  uint uVar1;
  FieldDescriptor **ppFVar2;
  long lVar3;
  ulong uVar4;
  FieldDescriptor **ppFVar5;
  FieldDescriptor **__i;
  ulong uVar6;
  
  uVar1 = *(uint *)(descriptor + 0x2c);
  uVar6 = (ulong)(int)uVar1;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)uVar6) {
    uVar4 = uVar6 * 8;
  }
  ppFVar2 = (FieldDescriptor **)operator_new__(uVar4);
  lVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  ppFVar5 = ppFVar2;
  for (; uVar4 * 0xa8 - lVar3 != 0; lVar3 = lVar3 + 0xa8) {
    *ppFVar5 = (FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar3);
    ppFVar5 = ppFVar5 + 1;
  }
  if (uVar1 != 0) {
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByNumber>>
              (ppFVar2,ppFVar2 + uVar6,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((int)uVar1 < 0x11) {
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar2,ppFVar2 + uVar6);
    }
    else {
      ppFVar5 = ppFVar2 + 0x10;
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar2,ppFVar5);
      for (lVar3 = uVar6 * 8 + -0x80; lVar3 != 0; lVar3 = lVar3 + -8) {
        std::
        __unguarded_linear_insert<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByNumber>>
                  (ppFVar5);
        ppFVar5 = ppFVar5 + 1;
      }
    }
  }
  return ppFVar2;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
      new const FieldDescriptor* [descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  sort(fields, fields + descriptor->field_count(), FieldOrderingByNumber());
  return fields;
}